

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O2

size_t testbench::machine::availability::count(void)

{
  anon_unknown_0::factory_init();
  return (anonymous_namespace)::machines[1] - *(anonymous_namespace)::machines >> 3;
}

Assistant:

size_t machine::availability::count()
{
    factory_init();
    return machines->names.size();
}